

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.h
# Opt level: O2

void __thiscall
GmmLib::GmmPageTablePool::GmmPageTablePool
          (GmmPageTablePool *this,HANDLE hAlloc,GMM_RESOURCE_INFO *pGmmRes,GMM_GFX_ADDRESS SysMem,
          POOL_TYPE Type)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint32_t *__s;
  SyncInfo *__s_00;
  byte bVar4;
  uint uVar5;
  GmmClientContext *pGVar3;
  
  this->NextPool = (GmmPageTablePool *)0x0;
  this->pClientContext = (GmmClientContext *)0x0;
  (this->PoolBBInfo).BBQueueHandle = (HANDLE)0x0;
  (this->PoolBBInfo).BBFence = 0;
  this->NodeUsage = (uint32_t *)0x0;
  this->NodeBBInfo = (SyncInfo *)0x0;
  this->PoolHandle = hAlloc;
  this->pGmmResInfo = pGmmRes;
  this->PoolGfxAddress = SysMem;
  this->CPUAddress = SysMem;
  this->NumFreeNodes = 0x200;
  this->PoolType = Type;
  if (pGmmRes == (GMM_RESOURCE_INFO *)0x0) {
LAB_001c3dbe:
    bVar4 = 2;
    if (Type != POOL_TYPE_AUXTTL1) {
LAB_001c3dd3:
      uVar5 = 0x10;
      if (Type == POOL_TYPE_AUXTTL2) {
        uVar5 = 2;
      }
      goto LAB_001c3de2;
    }
  }
  else {
    iVar2 = (*(pGmmRes->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x1b])(pGmmRes);
    pGVar3 = (GmmClientContext *)CONCAT44(extraout_var,iVar2);
    this->pClientContext = pGVar3;
    if (pGVar3 == (GmmClientContext *)0x0) goto LAB_001c3dbe;
    iVar2 = (*pGVar3->_vptr_GmmClientContext[3])(pGVar3);
    if (Type != POOL_TYPE_AUXTTL1) goto LAB_001c3dd3;
    bVar4 = 2;
    if ((CONCAT44(extraout_var_00,iVar2) != 0) &&
       (uVar1 = *(ulong *)(CONCAT44(extraout_var_00,iVar2) + 0x40), (uVar1 >> 0x2f & 1) == 0)) {
      bVar4 = ((uVar1 >> 0x2e & 1) != 0) + 1;
    }
  }
  uVar5 = (uint)(0x10 / bVar4);
LAB_001c3de2:
  __s = (uint32_t *)operator_new__((ulong)(uVar5 * 4));
  if (__s != (uint32_t *)0x0) {
    memset(__s,0,(ulong)(uVar5 * 4));
  }
  this->NodeUsage = __s;
  __s_00 = (SyncInfo *)operator_new__((ulong)(uVar5 << 9));
  if (__s_00 != (SyncInfo *)0x0) {
    memset(__s_00,0,(ulong)(uVar5 << 9));
  }
  this->NodeBBInfo = __s_00;
  return;
}

Assistant:

GmmPageTablePool(HANDLE hAlloc, GMM_RESOURCE_INFO* pGmmRes, GMM_GFX_ADDRESS SysMem, POOL_TYPE Type) :
            GmmPageTablePool()
        {
            int              DwordPoolSize;
            GMM_LIB_CONTEXT *pGmmLibContext;
            PoolHandle     = hAlloc;
            pGmmResInfo    = pGmmRes;
            PoolGfxAddress = SysMem;
            CPUAddress     = PoolGfxAddress;
            NextPool       = NULL;
            NumFreeNodes   = PAGETABLE_POOL_MAX_NODES;
            PoolType       = Type;
            if(pGmmResInfo)
            {
                pClientContext = pGmmResInfo->GetGmmClientContext();
            }
            pGmmLibContext = pClientContext ? pClientContext->GetLibContext() : NULL;
            DwordPoolSize  = (Type == POOL_TYPE_AUXTTL1) ? PAGETABLE_POOL_SIZE_IN_DWORD / AUX_L1TABLE_SIZE_IN_POOLNODES_2(pGmmLibContext) : (Type == POOL_TYPE_AUXTTL2) ? PAGETABLE_POOL_SIZE_IN_DWORD / AUX_L2TABLE_SIZE_IN_POOLNODES : PAGETABLE_POOL_SIZE_IN_DWORD;
            NodeUsage      = new uint32_t[DwordPoolSize]();
            NodeBBInfo     = new SyncInfo[DwordPoolSize * 32]();
	}